

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O2

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  UInt UVar6;
  ArrayIndex AVar7;
  Value *pVVar8;
  Value *pVVar9;
  Value *pVVar10;
  ostream *poVar11;
  cmSourceReqInfo *provide;
  pointer pcVar12;
  bool bVar13;
  string *this;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  const_iterator cVar14;
  string lookup_method_str;
  string wd;
  cmAlphaNum local_440;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  SelfType local_3e8;
  undefined1 local_3d8 [32];
  ValueIteratorBase local_3b8;
  Reader reader;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range4;
  SelfType local_280;
  Value ppio;
  SelfType local_248;
  ifstream ppf;
  
  Json::Value::Value(&ppio,nullValue);
  std::ifstream::ifstream(&ppf,(arg_pp->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader(&reader);
  bVar4 = Json::Reader::parse(&reader,(istream *)&ppf,&ppio,false);
  if (bVar4) {
    Json::Reader::~Reader(&reader);
    pVVar8 = Json::Value::operator[](&ppio,"version");
    UVar6 = Json::Value::asUInt(pVVar8);
    if (UVar6 < 2) {
      pVVar8 = Json::Value::operator[](&ppio,"rules");
      bVar4 = Json::Value::isArray(pVVar8);
      bVar13 = true;
      if (!bVar4) goto LAB_004475e8;
      AVar7 = Json::Value::size(pVVar8);
      if (AVar7 == 1) {
        cVar14 = Json::Value::begin(pVVar8);
        local_3b8.current_ = cVar14.super_ValueIteratorBase.current_._M_node;
        local_3b8.isNull_ = cVar14.super_ValueIteratorBase.isNull_;
        cVar14 = Json::Value::end(pVVar8);
        local_248.current_ = cVar14.super_ValueIteratorBase.current_._M_node;
        local_248.isNull_ = cVar14.super_ValueIteratorBase.isNull_;
        while( true ) {
          bVar4 = Json::ValueIteratorBase::operator!=(&local_3b8,&local_248);
          if (!bVar4) break;
          pVVar8 = Json::ValueIteratorBase::deref(&local_3b8);
          work_directory.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          pVVar9 = Json::Value::operator[](pVVar8,"work-directory");
          bVar4 = Json::Value::isString(pVVar9);
          if (!bVar4) {
            bVar4 = Json::Value::isNull(pVVar9);
            if (bVar4) goto LAB_004477ae;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map = (_Map_pointer)0x26;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
            local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
            local_440.View_._M_len = arg_pp->_M_string_length;
            cmStrCat<char[33]>(&wd,(cmAlphaNum *)&reader,&local_440,
                               (char (*) [33])": work-directory is not a string");
            cmSystemTools::Error(&wd);
LAB_0044886b:
            std::__cxx11::string::~string((string *)&wd);
LAB_0044867d:
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&work_directory);
            goto LAB_004475e6;
          }
          wd._M_dataplus._M_p = (pointer)&wd.field_2;
          wd._M_string_length = 0;
          wd.field_2._M_local_buf[0] = '\0';
          bVar4 = ParseFilename(pVVar9,&wd);
          if (bVar4) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&work_directory,&wd);
          }
          else {
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map = (_Map_pointer)0x26;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
            local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
            local_440.View_._M_len = arg_pp->_M_string_length;
            cmStrCat<char[15]>(&lookup_method_str,(cmAlphaNum *)&reader,&local_440,
                               (char (*) [15])": invalid blob");
            cmSystemTools::Error(&lookup_method_str);
            std::__cxx11::string::~string((string *)&lookup_method_str);
          }
          std::__cxx11::string::~string((string *)&wd);
          if (!bVar4) goto LAB_0044867d;
LAB_004477ae:
          bVar4 = Json::Value::isMember(pVVar8,"primary-output");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](pVVar8,"primary-output");
            bVar4 = ParseFilename(pVVar9,&info->PrimaryOutput);
            if (!bVar4) {
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x26;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
              local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
              local_440.View_._M_len = arg_pp->_M_string_length;
              cmStrCat<char[19]>(&wd,(cmAlphaNum *)&reader,&local_440,
                                 (char (*) [19])": invalid filename");
              cmSystemTools::Error(&wd);
              goto LAB_0044886b;
            }
            if ((work_directory.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_engaged == true) &&
               (work_directory.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length != 0)) {
              bVar4 = cmsys::SystemTools::FileIsFullPath(&info->PrimaryOutput);
              if (!bVar4) {
                reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_map =
                     (_Map_pointer)
                     work_directory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_string_length;
                reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_map_size =
                     (size_t)work_directory.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_dataplus._M_p;
                local_440.View_._M_len = 1;
                local_440.View_._M_str = local_440.Digits_;
                local_440.Digits_[0] = '/';
                cmStrCat<std::__cxx11::string>
                          (&wd,(cmAlphaNum *)&reader,&local_440,&info->PrimaryOutput);
                std::__cxx11::string::operator=((string *)info,(string *)&wd);
                std::__cxx11::string::~string((string *)&wd);
              }
            }
          }
          bVar4 = Json::Value::isMember(pVVar8,"outputs");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](pVVar8,"outputs");
            bVar4 = Json::Value::isArray(pVVar9);
            if (bVar4) {
              cVar14 = Json::Value::begin(pVVar9);
              local_3d8._0_8_ = cVar14.super_ValueIteratorBase.current_._M_node;
              local_3d8[8] = cVar14.super_ValueIteratorBase.isNull_;
              cVar14 = Json::Value::end(pVVar9);
              local_3e8.current_ = cVar14.super_ValueIteratorBase.current_._M_node;
              local_3e8.isNull_ = cVar14.super_ValueIteratorBase.isNull_;
              while( true ) {
                bVar4 = Json::ValueIteratorBase::operator!=
                                  ((ValueIteratorBase *)local_3d8,&local_3e8);
                if (!bVar4) break;
                pVVar9 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_3d8);
                wd._M_dataplus._M_p = (pointer)&wd.field_2;
                wd._M_string_length = 0;
                wd.field_2._M_local_buf[0] = '\0';
                bVar4 = ParseFilename(pVVar9,&wd);
                if (bVar4) {
                  if ((work_directory.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_engaged == true) &&
                     (work_directory.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length != 0)) {
                    bVar5 = cmsys::SystemTools::FileIsFullPath(&wd);
                    if (!bVar5) {
                      reader.nodes_.c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_map =
                           (_Map_pointer)
                           work_directory.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_string_length;
                      reader.nodes_.c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_map_size =
                           (size_t)work_directory.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload._M_value._M_dataplus._M_p;
                      local_440.View_._M_len = 1;
                      local_440.View_._M_str = local_440.Digits_;
                      local_440.Digits_[0] = '/';
                      cmStrCat<std::__cxx11::string>
                                (&lookup_method_str,(cmAlphaNum *)&reader,&local_440,&wd);
                      std::__cxx11::string::operator=((string *)&wd,(string *)&lookup_method_str);
                      std::__cxx11::string::~string((string *)&lookup_method_str);
                    }
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &info->ExtraOutputs,&wd);
                }
                else {
                  reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x26;
                  reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
                  local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
                  local_440.View_._M_len = arg_pp->_M_string_length;
                  cmStrCat<char[19]>(&lookup_method_str,(cmAlphaNum *)&reader,&local_440,
                                     (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  std::__cxx11::string::~string((string *)&lookup_method_str);
                }
                std::__cxx11::string::~string((string *)&wd);
                if (!bVar4) goto LAB_0044867d;
                Json::ValueIteratorBase::increment((ValueIteratorBase *)local_3d8);
              }
            }
          }
          bVar4 = Json::Value::isMember(pVVar8,"provides");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](pVVar8,"provides");
            bVar4 = Json::Value::isArray(pVVar9);
            if (!bVar4) {
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x26;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
              local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
              local_440.View_._M_len = arg_pp->_M_string_length;
              cmStrCat<char[27]>(&wd,(cmAlphaNum *)&reader,&local_440,
                                 (char (*) [27])": provides is not an array");
              cmSystemTools::Error(&wd);
              goto LAB_0044886b;
            }
            cVar14 = Json::Value::begin(pVVar9);
            local_3d8._0_8_ = cVar14.super_ValueIteratorBase.current_._M_node;
            local_3d8[8] = cVar14.super_ValueIteratorBase.isNull_;
            cVar14 = Json::Value::end(pVVar9);
            local_3e8.current_ = cVar14.super_ValueIteratorBase.current_._M_node;
            local_3e8.isNull_ = cVar14.super_ValueIteratorBase.isNull_;
            while( true ) {
              bVar4 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_3d8,&local_3e8)
              ;
              if (!bVar4) break;
              pVVar9 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_3d8);
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map =
                   &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map_size = 0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_ = 0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last =
                   (_Elt_pointer)
                   &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur._0_1_ = 0;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)&reader.errors_;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_2_ = 0x100;
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
              pVVar10 = Json::Value::operator[](pVVar9,"logical-name");
              bVar4 = ParseFilename(pVVar10,(string *)&reader);
              if (!bVar4) {
                local_440.View_._M_len = 0x26;
                local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                cmStrCat<char[15]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                   (char (*) [15])": invalid blob");
                cmSystemTools::Error(&lookup_method_str);
                goto LAB_00448668;
              }
              bVar4 = Json::Value::isMember(pVVar9,"compiled-module-path");
              if (bVar4) {
                pVVar10 = Json::Value::operator[](pVVar9,"compiled-module-path");
                bVar4 = ParseFilename(pVVar10,(string *)
                                              ((long)&reader.nodes_.c.
                                                                                                            
                                                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish + 0x10))
                ;
                if (!bVar4) {
                  local_440.View_._M_len = 0x26;
                  local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                  wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                  wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                  cmStrCat<char[19]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                     (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_00448668;
                }
                if ((work_directory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true) &&
                   (work_directory.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length != 0)) {
                  bVar4 = cmsys::SystemTools::FileIsFullPath
                                    ((string *)
                                     ((long)&reader.nodes_.c.
                                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                             ._M_impl.super__Deque_impl_data._M_finish + 0x10));
                  if (!bVar4) {
                    local_440.View_._M_len =
                         work_directory.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length;
                    local_440.View_._M_str =
                         (char *)work_directory.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._M_value._M_dataplus._M_p;
                    wd._M_dataplus._M_p = &DAT_00000001;
                    wd._M_string_length = (size_type)&wd.field_2;
                    wd.field_2._M_local_buf[0] = '/';
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&reader.nodes_.c.
                                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                     ._M_impl.super__Deque_impl_data._M_finish + 0x10);
                    cmStrCat<std::__cxx11::string>
                              (&lookup_method_str,&local_440,(cmAlphaNum *)&wd,pbVar1);
                    std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                    std::__cxx11::string::~string((string *)&lookup_method_str);
                  }
                }
              }
              bVar4 = Json::Value::isMember(pVVar9,"unique-on-source-path");
              if (bVar4) {
                pVVar10 = Json::Value::operator[](pVVar9,"unique-on-source-path");
                bVar4 = Json::Value::isBool(pVVar10);
                if (!bVar4) {
                  local_440.View_._M_len = 0x26;
                  local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                  wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                  wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                  cmStrCat<char[41]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                     (char (*) [41])": unique-on-source-path is not a boolean");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_00448668;
                }
                bVar4 = Json::Value::asBool(pVVar10);
              }
              else {
                bVar4 = false;
              }
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_ = bVar4;
              bVar4 = Json::Value::isMember(pVVar9,"source-path");
              if (bVar4) {
                pVVar10 = Json::Value::operator[](pVVar9,"source-path");
                bVar4 = ParseFilename(pVVar10,(string *)
                                              ((long)&reader.nodes_.c.
                                                                                                            
                                                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start + 0x10));
                if (!bVar4) {
                  local_440.View_._M_len = 0x26;
                  local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                  wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                  wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                  cmStrCat<char[19]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                     (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_00448668;
                }
                if ((work_directory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true) &&
                   (work_directory.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length != 0)) {
                  bVar4 = cmsys::SystemTools::FileIsFullPath
                                    ((string *)
                                     ((long)&reader.nodes_.c.
                                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                             ._M_impl.super__Deque_impl_data._M_start + 0x10));
                  if (!bVar4) {
                    local_440.View_._M_len =
                         work_directory.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length;
                    local_440.View_._M_str =
                         (char *)work_directory.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._M_value._M_dataplus._M_p;
                    wd._M_dataplus._M_p = &DAT_00000001;
                    wd._M_string_length = (size_type)&wd.field_2;
                    wd.field_2._M_local_buf[0] = '/';
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&reader.nodes_.c.
                                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start + 0x10);
                    cmStrCat<std::__cxx11::string>
                              (&lookup_method_str,&local_440,(cmAlphaNum *)&wd,pbVar1);
                    std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                    std::__cxx11::string::~string((string *)&lookup_method_str);
                  }
                }
              }
              else if ((char)reader.errors_.
                             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur == '\x01') {
                local_440.View_._M_len = 0x26;
                local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                cmStrCat<char[25]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                   (char (*) [25])": source-path is missing");
                cmSystemTools::Error(&lookup_method_str);
                goto LAB_00448668;
              }
              bVar4 = Json::Value::isMember(pVVar9,"is-interface");
              bVar5 = true;
              if (bVar4) {
                pVVar9 = Json::Value::operator[](pVVar9,"is-interface");
                bVar4 = Json::Value::isBool(pVVar9);
                if (!bVar4) {
                  local_440.View_._M_len = 0x26;
                  local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                  wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                  wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                  cmStrCat<char[32]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                     (char (*) [32])": is-interface is not a boolean");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_00448668;
                }
                bVar5 = Json::Value::asBool(pVVar9);
              }
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._1_1_ = bVar5;
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (&info->Provides,(value_type *)&reader);
              cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&reader);
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_3d8);
            }
          }
          bVar4 = Json::Value::isMember(pVVar8,"requires");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](pVVar8,"requires");
            bVar4 = Json::Value::isArray(pVVar9);
            if (!bVar4) {
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x26;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
              local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
              local_440.View_._M_len = arg_pp->_M_string_length;
              cmStrCat<char[27]>(&wd,(cmAlphaNum *)&reader,&local_440,
                                 (char (*) [27])": requires is not an array");
              cmSystemTools::Error(&wd);
              goto LAB_0044886b;
            }
            cVar14 = Json::Value::begin(pVVar9);
            local_3e8.current_ = cVar14.super_ValueIteratorBase.current_._M_node;
            local_3e8.isNull_ = cVar14.super_ValueIteratorBase.isNull_;
            cVar14 = Json::Value::end(pVVar9);
            local_280.current_ = cVar14.super_ValueIteratorBase.current_._M_node;
            local_280.isNull_ = cVar14.super_ValueIteratorBase.isNull_;
LAB_00447e7a:
            bVar4 = Json::ValueIteratorBase::operator!=(&local_3e8,&local_280);
            if (!bVar4) goto LAB_00448232;
            pVVar9 = Json::ValueIteratorBase::deref(&local_3e8);
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map =
                 &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_map_size = 0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur._0_1_ = 0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_last =
                 (_Elt_pointer)
                 &reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur._0_1_ = 0;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)&reader.errors_;
            reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            reader.errors_.
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
            reader.errors_.
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur._0_2_ = 0x100;
            reader.errors_.
            super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
            pVVar10 = Json::Value::operator[](pVVar9,"logical-name");
            bVar4 = ParseFilename(pVVar10,(string *)&reader);
            if (!bVar4) {
              local_440.View_._M_len = 0x26;
              local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
              wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
              wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
              cmStrCat<char[15]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                 (char (*) [15])": invalid blob");
              cmSystemTools::Error(&lookup_method_str);
              goto LAB_00448668;
            }
            bVar4 = Json::Value::isMember(pVVar9,"compiled-module-path");
            if (!bVar4) {
LAB_0044800d:
              bVar4 = Json::Value::isMember(pVVar9,"unique-on-source-path");
              if (bVar4) {
                pVVar10 = Json::Value::operator[](pVVar9,"unique-on-source-path");
                bVar4 = Json::Value::isBool(pVVar10);
                if (!bVar4) {
                  local_440.View_._M_len = 0x26;
                  local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                  wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                  wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                  cmStrCat<char[41]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                     (char (*) [41])": unique-on-source-path is not a boolean");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_00448668;
                }
                bVar4 = Json::Value::asBool(pVVar10);
              }
              else {
                bVar4 = false;
              }
              reader.errors_.
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur._0_1_ = bVar4;
              bVar4 = Json::Value::isMember(pVVar9,"source-path");
              if (bVar4) {
                pVVar10 = Json::Value::operator[](pVVar9,"source-path");
                bVar4 = ParseFilename(pVVar10,(string *)
                                              ((long)&reader.nodes_.c.
                                                                                                            
                                                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start + 0x10));
                if (!bVar4) {
                  local_440.View_._M_len = 0x26;
                  local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                  wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                  wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                  cmStrCat<char[19]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                     (char (*) [19])": invalid filename");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_00448668;
                }
                if ((work_directory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_engaged == true) &&
                   (work_directory.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length != 0)) {
                  bVar4 = cmsys::SystemTools::FileIsFullPath
                                    ((string *)
                                     ((long)&reader.nodes_.c.
                                             super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                             ._M_impl.super__Deque_impl_data._M_start + 0x10));
                  if (!bVar4) {
                    local_440.View_._M_len =
                         work_directory.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length;
                    local_440.View_._M_str =
                         (char *)work_directory.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._M_value._M_dataplus._M_p;
                    wd._M_dataplus._M_p = &DAT_00000001;
                    wd._M_string_length = (size_type)&wd.field_2;
                    wd.field_2._M_local_buf[0] = '/';
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&reader.nodes_.c.
                                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start + 0x10);
                    cmStrCat<std::__cxx11::string>
                              (&lookup_method_str,&local_440,(cmAlphaNum *)&wd,pbVar1);
                    std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                    std::__cxx11::string::~string((string *)&lookup_method_str);
                  }
                }
              }
              else if ((char)reader.errors_.
                             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur == '\x01') {
                local_440.View_._M_len = 0x26;
                local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                cmStrCat<char[25]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                   (char (*) [25])": source-path is missing");
                cmSystemTools::Error(&lookup_method_str);
                goto LAB_00448668;
              }
              bVar4 = Json::Value::isMember(pVVar9,"lookup-method");
              if (bVar4) {
                pVVar9 = Json::Value::operator[](pVVar9,"lookup-method");
                bVar4 = Json::Value::isString(pVVar9);
                if (!bVar4) {
                  local_440.View_._M_len = 0x26;
                  local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                  wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                  wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                  cmStrCat<char[32]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                                     (char (*) [32])": lookup-method is not a string");
                  cmSystemTools::Error(&lookup_method_str);
                  goto LAB_00448668;
                }
                Json::Value::asString_abi_cxx11_(&lookup_method_str,pVVar9);
                __y._M_str = "by-name";
                __y._M_len = 7;
                __x._M_str = lookup_method_str._M_dataplus._M_p;
                __x._M_len = lookup_method_str._M_string_length;
                bVar4 = std::operator==(__x,__y);
                uVar3 = 0;
                if (!bVar4) {
                  __y_00._M_str = "include-angle";
                  __y_00._M_len = 0xd;
                  __x_00._M_str = lookup_method_str._M_dataplus._M_p;
                  __x_00._M_len = lookup_method_str._M_string_length;
                  bVar4 = std::operator==(__x_00,__y_00);
                  uVar3 = 1;
                  if (!bVar4) {
                    __y_01._M_str = "include-quote";
                    __y_01._M_len = 0xd;
                    __x_01._M_str = lookup_method_str._M_dataplus._M_p;
                    __x_01._M_len = lookup_method_str._M_string_length;
                    bVar4 = std::operator==(__x_01,__y_01);
                    uVar3 = 2;
                    if (!bVar4) {
                      local_440.View_._M_len = 0x26;
                      local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
                      wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
                      wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
                      cmStrCat<char[33],std::__cxx11::string>
                                ((string *)local_3d8,&local_440,(cmAlphaNum *)&wd,
                                 (char (*) [33])": lookup-method is not a valid: ",
                                 &lookup_method_str);
                      cmSystemTools::Error((string *)local_3d8);
                      std::__cxx11::string::~string((string *)local_3d8);
                      goto LAB_00448668;
                    }
                  }
                }
                reader.errors_.
                super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = uVar3;
                std::__cxx11::string::~string((string *)&lookup_method_str);
              }
              else if ((char)reader.errors_.
                             super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur == '\x01') {
                reader.errors_.
                super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
              }
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (&info->Requires,(value_type *)&reader);
              cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&reader);
              Json::ValueIteratorBase::increment(&local_3e8);
              goto LAB_00447e7a;
            }
            pVVar10 = Json::Value::operator[](pVVar9,"compiled-module-path");
            bVar4 = ParseFilename(pVVar10,(string *)
                                          ((long)&reader.nodes_.c.
                                                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish + 0x10))
            ;
            if (bVar4) {
              if ((work_directory.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_engaged == true) &&
                 (work_directory.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length != 0)) {
                bVar4 = cmsys::SystemTools::FileIsFullPath
                                  ((string *)
                                   ((long)&reader.nodes_.c.
                                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                                           ._M_impl.super__Deque_impl_data._M_finish + 0x10));
                if (!bVar4) {
                  local_440.View_._M_len =
                       work_directory.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_string_length;
                  local_440.View_._M_str =
                       (char *)work_directory.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._M_value._M_dataplus._M_p;
                  wd._M_dataplus._M_p = &DAT_00000001;
                  wd._M_string_length = (size_type)&wd.field_2;
                  wd.field_2._M_local_buf[0] = '/';
                  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&reader.nodes_.c.
                                   super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                                   _M_impl.super__Deque_impl_data._M_finish + 0x10);
                  cmStrCat<std::__cxx11::string>
                            (&lookup_method_str,&local_440,(cmAlphaNum *)&wd,pbVar1);
                  std::__cxx11::string::operator=((string *)pbVar1,(string *)&lookup_method_str);
                  std::__cxx11::string::~string((string *)&lookup_method_str);
                }
              }
              goto LAB_0044800d;
            }
            local_440.View_._M_len = 0x26;
            local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
            wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
            wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
            cmStrCat<char[19]>(&lookup_method_str,&local_440,(cmAlphaNum *)&wd,
                               (char (*) [19])": invalid filename");
            cmSystemTools::Error(&lookup_method_str);
LAB_00448668:
            std::__cxx11::string::~string((string *)&lookup_method_str);
            cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&reader);
            goto LAB_0044867d;
          }
LAB_00448232:
          bVar4 = Json::Value::isMember(pVVar8,"is-interface");
          if (bVar4) {
            poVar11 = std::operator<<((ostream *)&std::cerr,
                                      "warning: acknowledging an VS 17.3 toolchain bug; accepting until a new release which fixes it is available"
                                     );
            std::endl<char,std::char_traits<char>>(poVar11);
            pVVar8 = Json::Value::operator[](pVVar8,"is-interface");
            bVar4 = Json::Value::isBool(pVVar8);
            if (!bVar4) {
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x26;
              reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
              local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
              local_440.View_._M_len = arg_pp->_M_string_length;
              cmStrCat<char[32]>(&wd,(cmAlphaNum *)&reader,&local_440,
                                 (char (*) [32])": is-interface is not a boolean");
              cmSystemTools::Error(&wd);
              goto LAB_0044886b;
            }
            bVar4 = Json::Value::asBool(pVVar8);
            pcVar2 = (info->Provides).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pcVar12 = (info->Provides).
                           super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
                           _M_impl.super__Vector_impl_data._M_start; pcVar12 != pcVar2;
                pcVar12 = pcVar12 + 1) {
              pcVar12->IsInterface = bVar4;
            }
          }
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&work_directory);
          Json::ValueIteratorBase::increment(&local_3b8);
        }
        goto LAB_004475e8;
      }
      reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x26;
      reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
      local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
      local_440.View_._M_len = arg_pp->_M_string_length;
      cmStrCat<char[26]>(&wd,(cmAlphaNum *)&reader,&local_440,
                         (char (*) [26])": expected 1 source entry");
      cmSystemTools::Error(&wd);
      this = &wd;
    }
    else {
      reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x26;
      reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map_size = (size_t)anon_var_dwarf_111d307;
      local_440.View_._M_str = (arg_pp->_M_dataplus)._M_p;
      local_440.View_._M_len = arg_pp->_M_string_length;
      Json::Value::asString_abi_cxx11_((String *)&work_directory,pVVar8);
      cmStrCat<char[11],std::__cxx11::string>
                (&wd,(cmAlphaNum *)&reader,&local_440,(char (*) [11])": version ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &work_directory);
      cmSystemTools::Error(&wd);
      std::__cxx11::string::~string((string *)&wd);
      this = (string *)&work_directory;
    }
    std::__cxx11::string::~string((string *)this);
  }
  else {
    local_440.View_._M_len = 0x26;
    local_440.View_._M_str = "-E cmake_ninja_dyndep failed to parse ";
    wd._M_string_length = (size_type)(arg_pp->_M_dataplus)._M_p;
    wd._M_dataplus._M_p = (pointer)arg_pp->_M_string_length;
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&lookup_method_str,&reader);
    cmStrCat<std::__cxx11::string>
              ((string *)&work_directory,&local_440,(cmAlphaNum *)&wd,&lookup_method_str);
    cmSystemTools::Error((string *)&work_directory);
    std::__cxx11::string::~string((string *)&work_directory);
    std::__cxx11::string::~string((string *)&lookup_method_str);
    Json::Reader::~Reader(&reader);
  }
LAB_004475e6:
  bVar13 = false;
LAB_004475e8:
  std::ifstream::~ifstream(&ppf);
  Json::Value::~Value(&ppio);
  return bVar13;
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }

      // MSVC 17.3 toolchain bug. Remove when 17.4 is available.
      if (rule.isMember("is-interface")) {
        std::cerr
          << "warning: acknowledging an VS 17.3 toolchain bug; accepting "
             "until a new release which fixes it is available"
          << std::endl;

        Json::Value const& is_interface_json = rule["is-interface"];
        if (!is_interface_json.isBool()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": is-interface is not a boolean"));
          return false;
        }
        bool is_interface = is_interface_json.asBool();

        for (auto& provide : info->Provides) {
          provide.IsInterface = is_interface;
        }
      }
    }
  }

  return true;
}